

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int nTestCase;
  CTestTricycle *this;
  int test_case;
  char **argv_local;
  int argc_local;
  
  if (argc == 2) {
    nTestCase = atoi(argv[1]);
    if ((nTestCase < 1) || (4 < nTestCase)) {
      ShowUsage(*argv);
    }
    else {
      this = TSingleton<CTestTricycle>::GetInstance();
      CTestTricycle::Run(this,nTestCase);
    }
  }
  else {
    ShowUsage(*argv);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	/// test case number
	int test_case = -1;

	/// check arguments
	if (argc != 2)
	{
		ShowUsage(argv[0]);
		return 0;
	}

	/// convert to integer
	test_case = atoi(argv[1]);

	/// if the argument is not within the range
	if (test_case <= 0 || test_case > TEST_CASE_NUM)
	{
		ShowUsage(argv[0]);
		return 0;
	}

	/// run test code
	CTestTricycle::GetInstance()->Run(test_case);

	return 0;
}